

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O3

void duckdb::Node4::ShrinkNode16(ART *art,Node *node4,Node *node16)

{
  byte *pbVar1;
  uint8_t uVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar5;
  type paVar6;
  iterator iVar7;
  pointer this;
  data_ptr_t pdVar8;
  ulong uVar9;
  long lVar10;
  ulong local_38;
  
  pBVar5 = BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,node4);
  uVar9 = (node16->super_IndexPointer).data;
  paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar6->_M_elems[3].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38 = uVar9 & 0xffffffff;
  iVar7 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var3._M_head_impl)->buffers)._M_h,&local_38);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar8 = FixedSizeBuffer::Get(this,true);
  lVar10 = (ulong)((uint)(uVar9 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pbVar1 = pdVar8 + iVar4 + lVar10;
  (node4->super_IndexPointer).data =
       (node16->super_IndexPointer).data & 0x8000000000000000 |
       (node4->super_IndexPointer).data & 0x7fffffffffffffff;
  uVar2 = pdVar8[iVar4 + lVar10];
  pBVar5->count = uVar2;
  if (uVar2 != '\0') {
    uVar9 = 0;
    do {
      pBVar5->key[uVar9] = pbVar1[uVar9 + 1];
      pBVar5->children[uVar9].super_IndexPointer.data = *(idx_t *)(pbVar1 + uVar9 * 8 + 0x18);
      uVar9 = uVar9 + 1;
    } while (uVar9 < *pbVar1);
  }
  *pbVar1 = 0;
  Node::Free(art,node16);
  return;
}

Assistant:

void Node4::ShrinkNode16(ART &art, Node &node4, Node &node16) {
	auto &n4 = New(art, node4);
	auto &n16 = Node::Ref<Node16>(art, node16, NType::NODE_16);
	node4.SetGateStatus(node16.GetGateStatus());

	n4.count = n16.count;
	for (uint8_t i = 0; i < n16.count; i++) {
		n4.key[i] = n16.key[i];
		n4.children[i] = n16.children[i];
	}

	n16.count = 0;
	Node::Free(art, node16);
}